

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O1

int kinLsDQJtimes(N_Vector v,N_Vector Jv,N_Vector u,int *new_u,void *kinmem)

{
  N_Vector_Ops p_Var1;
  int iVar2;
  double dVar3;
  ulong extraout_XMM0_Qb;
  double dVar4;
  KINMem kin_mem;
  KINLsMem kinls_mem;
  KINMem local_50;
  double local_48;
  ulong uStack_40;
  double local_38;
  KINLsMem local_30;
  
  iVar2 = kinLs_AccessLMem(kinmem,"kinLsDQJtimes",&local_50,&local_30);
  if (iVar2 == 0) {
    p_Var1 = v->ops;
    if ((((p_Var1->nvprod == (_func_void_N_Vector_N_Vector_N_Vector *)0x0) ||
         (p_Var1->nvdotprod == (_func_sunrealtype_N_Vector_N_Vector *)0x0)) ||
        (p_Var1->nvl1norm == (_func_sunrealtype_N_Vector *)0x0)) ||
       (p_Var1->nvlinearsum == (_func_void_sunrealtype_N_Vector_sunrealtype_N_Vector_N_Vector *)0x0)
       ) {
      iVar2 = -3;
      KINProcessError(local_50,-3,0x3c2,"kinLsDQJtimes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                      ,"A required vector operation is not implemented.");
    }
    else {
      N_VProd(v,local_50->kin_uscale,local_50->kin_vtemp1);
      N_VProd(u,local_50->kin_uscale,Jv);
      local_48 = (double)N_VDotProd(Jv,local_50->kin_vtemp1);
      uStack_40 = extraout_XMM0_Qb;
      local_38 = (double)N_VDotProd(local_50->kin_vtemp1,local_50->kin_vtemp1);
      dVar3 = (double)N_VL1Norm(local_50->kin_vtemp1);
      uStack_40 = uStack_40 & 0x7fffffffffffffff;
      dVar4 = ABS(local_48);
      if (ABS(local_48) <= dVar3) {
        dVar4 = dVar3;
      }
      local_48 = (dVar4 * (double)(~-(ulong)(0.0 <= local_48) & (ulong)-local_50->kin_sqrt_relfunc |
                                  (ulong)local_50->kin_sqrt_relfunc & -(ulong)(0.0 <= local_48))) /
                 local_38;
      N_VLinearSum(0x3ff0000000000000,u,v,local_50->kin_vtemp1);
      iVar2 = (*local_30->jt_func)
                        (local_50->kin_vtemp1,local_50->kin_vtemp2,local_50->kin_user_data);
      local_30->nfeDQ = local_30->nfeDQ + 1;
      if (iVar2 == 0) {
        N_VLinearSum(1.0 / local_48,-(1.0 / local_48),local_50->kin_vtemp2,local_50->kin_fval,Jv);
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int kinLsDQJtimes(N_Vector v, N_Vector Jv, N_Vector u,
                  SUNDIALS_MAYBE_UNUSED sunbooleantype* new_u, void* kinmem)
{
  sunrealtype sigma, sigma_inv, sutsv, sq1norm, sign, vtv;
  KINMem kin_mem;
  KINLsMem kinls_mem;
  int retval;

  /* access KINLsMem structure */
  retval = kinLs_AccessLMem(kinmem, __func__, &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS) { return (retval); }

  /* ensure that NVector supplies requisite routines */
  if ((v->ops->nvprod == NULL) || (v->ops->nvdotprod == NULL) ||
      (v->ops->nvl1norm == NULL) || (v->ops->nvlinearsum == NULL))
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_LS_BAD_NVECTOR);
    return (KINLS_ILL_INPUT);
  }

  /* scale the vector v and put Du*v into vtemp1 */
  N_VProd(v, kin_mem->kin_uscale, kin_mem->kin_vtemp1);

  /* scale u and put into Jv (used as a temporary storage) */
  N_VProd(u, kin_mem->kin_uscale, Jv);

  /* compute dot product (Du*u).(Du*v) */
  sutsv = N_VDotProd(Jv, kin_mem->kin_vtemp1);

  /* compute dot product (Du*v).(Du*v) */
  vtv = N_VDotProd(kin_mem->kin_vtemp1, kin_mem->kin_vtemp1);

  /* compute differencing factor -- this is from p. 469, Brown and Saad paper */
  sq1norm = N_VL1Norm(kin_mem->kin_vtemp1);
  sign    = (sutsv >= ZERO) ? ONE : -ONE;
  sigma = sign * (kin_mem->kin_sqrt_relfunc) * SUNMAX(SUNRabs(sutsv), sq1norm) /
          vtv;
  sigma_inv = ONE / sigma;

  /* compute the u-prime at which to evaluate the function func */
  N_VLinearSum(ONE, u, sigma, v, kin_mem->kin_vtemp1);

  /* call the system function to calculate func(u+sigma*v) */
  retval = kinls_mem->jt_func(kin_mem->kin_vtemp1, kin_mem->kin_vtemp2,
                              kin_mem->kin_user_data);
  kinls_mem->nfeDQ++;
  if (retval != 0) { return (retval); }

  /* finish the computation of the difference quotient */
  N_VLinearSum(sigma_inv, kin_mem->kin_vtemp2, -sigma_inv, kin_mem->kin_fval, Jv);

  return (0);
}